

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeSetErrHandlerFn(void *cvode_mem,CVErrHandlerFn ehfun,void *eh_data)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetErrHandlerFn","cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    *(undefined8 *)(in_RDI + 0x470) = in_RSI;
    *(undefined8 *)(in_RDI + 0x478) = in_RDX;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeSetErrHandlerFn(void *cvode_mem, CVErrHandlerFn ehfun, void *eh_data)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetErrHandlerFn", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  cv_mem->cv_ehfun = ehfun;
  cv_mem->cv_eh_data = eh_data;

  return(CV_SUCCESS);
}